

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::SGXMLScanner::scanRawAttrListforNameSpaces(SGXMLScanner *this,XMLSize_t attCount)

{
  SchemaValidator *pSVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  KVStringPair *pKVar5;
  XMLCh *pXVar6;
  XMLCh *pXVar7;
  XMLBuffer *pXVar8;
  DVHashTable *pDVar9;
  DatatypeValidator *pDVar10;
  DatatypeValidator *tempDV_1;
  XMLBuffer *fXsiNil;
  XMLBufBid bbXsi_1;
  uint uriId;
  int colonPos;
  DatatypeValidator *tempDV;
  XMLBuffer *fXsiType;
  XMLBufBid bbXsi;
  XMLCh *suffPtr_1;
  XMLCh *valuePtr_2;
  XMLCh *pXStack_90;
  int colonInd_1;
  XMLCh *prefPtr_1;
  XMLCh *rawPtr_2;
  KVStringPair *curPair_2;
  XMLSize_t index_2;
  XMLCh *suffPtr;
  XMLCh *valuePtr_1;
  XMLCh *pXStack_58;
  int colonInd;
  XMLCh *prefPtr;
  XMLCh *rawPtr_1;
  KVStringPair *curPair_1;
  XMLSize_t index_1;
  XMLCh *valuePtr;
  XMLCh *rawPtr;
  KVStringPair *curPair;
  XMLSize_t index;
  XMLSize_t attCount_local;
  SGXMLScanner *this_local;
  
  for (curPair = (KVStringPair *)0x0; curPair < attCount;
      curPair = (KVStringPair *)((long)&(curPair->super_XSerializable)._vptr_XSerializable + 1)) {
    pKVar5 = BaseRefVectorOf<xercesc_4_0::KVStringPair>::elementAt
                       (&this->fRawAttrList->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>,
                        (XMLSize_t)curPair);
    pXVar6 = KVStringPair::getKey(pKVar5);
    iVar3 = XMLString::compareNString(pXVar6,(XMLCh *)XMLUni::fgXMLNSColonString,6);
    if ((iVar3 == 0) || (bVar2 = XMLString::equals(pXVar6,(XMLCh *)XMLUni::fgXMLNSString), bVar2)) {
      pXVar7 = KVStringPair::getValue(pKVar5);
      updateNSMap(this,pXVar6,pXVar7,this->fRawAttrColonList[(long)curPair]);
      bVar2 = XMLString::equals(pXVar7,(XMLCh *)SchemaSymbols::fgURI_XSI);
      if (bVar2) {
        this->fSeeXsi = true;
      }
    }
  }
  if ((this->fSeeXsi & 1U) != 0) {
    for (curPair_1 = (KVStringPair *)0x0; curPair_1 < attCount;
        curPair_1 = (KVStringPair *)
                    ((long)&(curPair_1->super_XSerializable)._vptr_XSerializable + 1)) {
      pKVar5 = BaseRefVectorOf<xercesc_4_0::KVStringPair>::elementAt
                         (&this->fRawAttrList->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>,
                          (XMLSize_t)curPair_1);
      pXVar6 = KVStringPair::getKey(pKVar5);
      iVar3 = this->fRawAttrColonList[(long)curPair_1];
      if (iVar3 == -1) {
        pXStack_58 = L"";
      }
      else {
        XMLBuffer::set(&(this->super_XMLScanner).fURIBuf,pXVar6,(long)iVar3);
        pXStack_58 = XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fURIBuf);
      }
      uVar4 = XMLScanner::resolvePrefix(&this->super_XMLScanner,pXStack_58,Mode_Attribute);
      if (uVar4 == (this->super_XMLScanner).fSchemaNamespaceId) {
        pXVar7 = KVStringPair::getValue(pKVar5);
        bVar2 = XMLString::equals(pXVar6 + (iVar3 + 1),(XMLCh *)SchemaSymbols::fgXSI_SCHEMALOCATION)
        ;
        if (bVar2) {
          parseSchemaLocation(this,pXVar7,false);
        }
        else {
          bVar2 = XMLString::equals(pXVar6 + (iVar3 + 1),
                                    (XMLCh *)SchemaSymbols::fgXSI_NONAMESPACESCHEMALOCATION);
          if (bVar2) {
            resolveSchemaGrammar(this,pXVar7,L"",false);
          }
        }
      }
    }
    if (((this->super_XMLScanner).fValidator != (XMLValidator *)0x0) &&
       (uVar4 = (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[0xd])(),
       (uVar4 & 1) != 0)) {
      for (curPair_2 = (KVStringPair *)0x0; curPair_2 < attCount;
          curPair_2 = (KVStringPair *)
                      ((long)&(curPair_2->super_XSerializable)._vptr_XSerializable + 1)) {
        pKVar5 = BaseRefVectorOf<xercesc_4_0::KVStringPair>::elementAt
                           (&this->fRawAttrList->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>,
                            (XMLSize_t)curPair_2);
        pXVar6 = KVStringPair::getKey(pKVar5);
        iVar3 = this->fRawAttrColonList[(long)curPair_2];
        if (iVar3 == -1) {
          pXStack_90 = L"";
        }
        else {
          XMLBuffer::set(&(this->super_XMLScanner).fURIBuf,pXVar6,(long)iVar3);
          pXStack_90 = XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fURIBuf);
        }
        uVar4 = XMLScanner::resolvePrefix(&this->super_XMLScanner,pXStack_90,Mode_Attribute);
        if (uVar4 == (this->super_XMLScanner).fSchemaNamespaceId) {
          pXVar7 = KVStringPair::getValue(pKVar5);
          bbXsi.fMgr = (XMLBufferMgr *)(pXVar6 + (iVar3 + 1));
          bVar2 = XMLString::equals((XMLCh *)bbXsi.fMgr,(XMLCh *)SchemaSymbols::fgXSI_TYPE);
          if (bVar2) {
            XMLBufBid::XMLBufBid((XMLBufBid *)&fXsiType,&(this->super_XMLScanner).fBufMgr);
            pXVar8 = XMLBufBid::getBuffer((XMLBufBid *)&fXsiType);
            pDVar9 = DatatypeValidatorFactory::getBuiltInRegistry();
            pDVar10 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                                (pDVar9,SchemaSymbols::fgDT_QNAME);
            normalizeAttRawValue(this,(XMLCh *)SchemaSymbols::fgXSI_TYPE,pXVar7,pXVar8);
            pSVar1 = (SchemaValidator *)(this->super_XMLScanner).fValidator;
            pXVar6 = XMLBuffer::getRawBuffer(pXVar8);
            SchemaValidator::normalizeWhiteSpace(pSVar1,pDVar10,pXVar6,pXVar8,true);
            bVar2 = XMLBuffer::isEmpty(pXVar8);
            if (!bVar2) {
              bbXsi_1.fMgr._4_4_ = -1;
              pXVar6 = XMLBuffer::getRawBuffer(pXVar8);
              bbXsi_1.fMgr._0_4_ =
                   XMLScanner::resolveQName
                             (&this->super_XMLScanner,pXVar6,&(this->super_XMLScanner).fPrefixBuf,
                              Mode_Element,(int *)((long)&bbXsi_1.fMgr + 4));
              pSVar1 = (SchemaValidator *)(this->super_XMLScanner).fValidator;
              pXVar6 = XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fPrefixBuf);
              pXVar7 = XMLBuffer::getRawBuffer(pXVar8);
              SchemaValidator::setXsiType
                        (pSVar1,pXVar6,pXVar7 + (long)bbXsi_1.fMgr._4_4_ + 1,(uint)bbXsi_1.fMgr);
            }
            XMLBufBid::~XMLBufBid((XMLBufBid *)&fXsiType);
          }
          else {
            bVar2 = XMLString::equals((XMLCh *)bbXsi.fMgr,L"nil");
            if (bVar2) {
              XMLBufBid::XMLBufBid((XMLBufBid *)&fXsiNil,&(this->super_XMLScanner).fBufMgr);
              pXVar8 = XMLBufBid::getBuffer((XMLBufBid *)&fXsiNil);
              pDVar9 = DatatypeValidatorFactory::getBuiltInRegistry();
              pDVar10 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::
                        get(pDVar9,SchemaSymbols::fgDT_BOOLEAN);
              normalizeAttRawValue(this,L"nil",pXVar7,pXVar8);
              pSVar1 = (SchemaValidator *)(this->super_XMLScanner).fValidator;
              pXVar6 = XMLBuffer::getRawBuffer(pXVar8);
              SchemaValidator::normalizeWhiteSpace(pSVar1,pDVar10,pXVar6,pXVar8,true);
              pXVar6 = XMLBuffer::getRawBuffer(pXVar8);
              bVar2 = XMLString::equals(pXVar6,(XMLCh *)SchemaSymbols::fgATTVAL_TRUE);
              if (bVar2) {
                SchemaValidator::setNillable
                          ((SchemaValidator *)(this->super_XMLScanner).fValidator,true);
              }
              else {
                pXVar6 = XMLBuffer::getRawBuffer(pXVar8);
                bVar2 = XMLString::equals(pXVar6,(XMLCh *)SchemaSymbols::fgATTVAL_FALSE);
                if (bVar2) {
                  SchemaValidator::setNillable
                            ((SchemaValidator *)(this->super_XMLScanner).fValidator,false);
                }
                else {
                  pXVar6 = XMLBuffer::getRawBuffer(pXVar8);
                  XMLScanner::emitError
                            (&this->super_XMLScanner,InvalidAttValue,pXVar6,pXVar7,(XMLCh *)0x0,
                             (XMLCh *)0x0);
                }
              }
              XMLBufBid::~XMLBufBid((XMLBufBid *)&fXsiNil);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SGXMLScanner::scanRawAttrListforNameSpaces(XMLSize_t attCount)
{
    //  Make an initial pass through the list and find any xmlns attributes or
    //  schema attributes.
    //  When we find one, send it off to be used to update the element stack's
    //  namespace mappings.
    for (XMLSize_t index = 0; index < attCount; index++)
    {
        // each attribute has the prefix:suffix="value"
        const KVStringPair* curPair = fRawAttrList->elementAt(index);
        const XMLCh* rawPtr = curPair->getKey();

        //  If either the key begins with "xmlns:" or its just plain
        //  "xmlns", then use it to update the map.
        if (!XMLString::compareNString(rawPtr, XMLUni::fgXMLNSColonString, 6)
        ||  XMLString::equals(rawPtr, XMLUni::fgXMLNSString))
        {
            const XMLCh* valuePtr = curPair->getValue();

            updateNSMap(rawPtr, valuePtr, fRawAttrColonList[index]);

            // if the schema URI is seen in the the valuePtr, set the boolean seeXsi
            if (XMLString::equals(valuePtr, SchemaSymbols::fgURI_XSI)) {
                fSeeXsi = true;
            }
        }
    }

    // walk through the list again to deal with "xsi:...."
    if (fSeeXsi)
    {
        for (XMLSize_t index = 0; index < attCount; index++)
        {
            // each attribute has the prefix:suffix="value"
            const KVStringPair* curPair = fRawAttrList->elementAt(index);
            const XMLCh* rawPtr = curPair->getKey();
            const XMLCh* prefPtr;

            int   colonInd = fRawAttrColonList[index];

            if (colonInd != -1) {
                fURIBuf.set(rawPtr, colonInd);
                prefPtr = fURIBuf.getRawBuffer();
            }
            else {
                prefPtr = XMLUni::fgZeroLenString;
            }

            // if schema URI has been seen, scan for the schema location and uri
            // and resolve the schema grammar
            if (resolvePrefix(prefPtr, ElemStack::Mode_Attribute) == fSchemaNamespaceId) {

                const XMLCh* valuePtr = curPair->getValue();
                const XMLCh*  suffPtr = &rawPtr[colonInd + 1];

                if (XMLString::equals(suffPtr, SchemaSymbols::fgXSI_SCHEMALOCATION))
                    parseSchemaLocation(valuePtr);
                else if (XMLString::equals(suffPtr, SchemaSymbols::fgXSI_NONAMESPACESCHEMALOCATION))
                    resolveSchemaGrammar(valuePtr, XMLUni::fgZeroLenString);
            }
        }

        // do it another time, as xsi:type and xsi:nill only work if the schema grammar has been already
        // loaded (JIRA XERCESC-1937)
        if (fValidator && fValidator->handlesSchema())
        {
            for (XMLSize_t index = 0; index < attCount; index++)
            {
                // each attribute has the prefix:suffix="value"
                const KVStringPair* curPair = fRawAttrList->elementAt(index);
                const XMLCh* rawPtr = curPair->getKey();
                const XMLCh* prefPtr;

                int   colonInd = fRawAttrColonList[index];

                if (colonInd != -1) {
                    fURIBuf.set(rawPtr, colonInd);
                    prefPtr = fURIBuf.getRawBuffer();
                }
                else {
                    prefPtr = XMLUni::fgZeroLenString;
                }

                // scan for schema type
                if (resolvePrefix(prefPtr, ElemStack::Mode_Attribute) == fSchemaNamespaceId) {

                    const XMLCh* valuePtr = curPair->getValue();
                    const XMLCh*  suffPtr = &rawPtr[colonInd + 1];

                    if (XMLString::equals(suffPtr, SchemaSymbols::fgXSI_TYPE))
                    {
                        XMLBufBid bbXsi(&fBufMgr);
                        XMLBuffer& fXsiType = bbXsi.getBuffer();

                        // normalize the attribute according to schema whitespace facet
                        DatatypeValidator* tempDV = DatatypeValidatorFactory::getBuiltInRegistry()->get(SchemaSymbols::fgDT_QNAME);
                        normalizeAttRawValue(SchemaSymbols::fgXSI_TYPE, valuePtr, fXsiType);
                        ((SchemaValidator*) fValidator)->normalizeWhiteSpace(tempDV, fXsiType.getRawBuffer(), fXsiType, true);
                        if (!fXsiType.isEmpty()) {
                            int colonPos = -1;
                            unsigned int uriId = resolveQName (
                                  fXsiType.getRawBuffer()
                                , fPrefixBuf
                                , ElemStack::Mode_Element
                                , colonPos
                            );
                            ((SchemaValidator*)fValidator)->setXsiType(fPrefixBuf.getRawBuffer(), fXsiType.getRawBuffer() + colonPos + 1, uriId);
                        }
                    }
                    else if (XMLString::equals(suffPtr, SchemaSymbols::fgATT_NILL))
                    {
                        // normalize the attribute according to schema whitespace facet
                        XMLBufBid bbXsi(&fBufMgr);
                        XMLBuffer& fXsiNil = bbXsi.getBuffer();

                        DatatypeValidator* tempDV = DatatypeValidatorFactory::getBuiltInRegistry()->get(SchemaSymbols::fgDT_BOOLEAN);
                        normalizeAttRawValue(SchemaSymbols::fgATT_NILL, valuePtr, fXsiNil);
                        ((SchemaValidator*) fValidator)->normalizeWhiteSpace(tempDV, fXsiNil.getRawBuffer(), fXsiNil, true);
                        if(XMLString::equals(fXsiNil.getRawBuffer(), SchemaSymbols::fgATTVAL_TRUE))
                            ((SchemaValidator*)fValidator)->setNillable(true);
                        else if(XMLString::equals(fXsiNil.getRawBuffer(), SchemaSymbols::fgATTVAL_FALSE))
                            ((SchemaValidator*)fValidator)->setNillable(false);
                        else
                            emitError(XMLErrs::InvalidAttValue, fXsiNil.getRawBuffer(), valuePtr);
                    }
                }
            }
        }
    }
}